

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_path_arc_to_fast
               (nk_draw_list *list,nk_vec2 center,float radius,int a_min,int a_max)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  nk_vec2 pos;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  nk_vec2 list_00;
  float in_XMM1_Da;
  float y;
  float x;
  nk_vec2 c;
  int a;
  float local_28;
  float fStack_24;
  int local_20;
  float local_8;
  float fStack_4;
  
  if ((in_RDI != 0) && (local_20 = in_ESI, in_ESI <= in_EDX)) {
    for (; local_20 <= in_EDX; local_20 = local_20 + 1) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)local_20;
      uVar1 = *(undefined8 *)
               (in_RDI + 0x10 +
               (ulong)((local_20 +
                       (SUB164(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) >> 1 & 0xfffffffc) * -3) * 8)
               );
      local_8 = (float)in_XMM0_Qa;
      local_28 = (float)uVar1;
      local_8 = local_28 * in_XMM1_Da + local_8;
      fStack_4 = (float)((ulong)in_XMM0_Qa >> 0x20);
      fStack_24 = (float)((ulong)uVar1 >> 0x20);
      fStack_4 = fStack_24 * in_XMM1_Da + fStack_4;
      list_00 = nk_vec2(local_8,fStack_4);
      pos.y = local_8;
      pos.x = fStack_4;
      nk_draw_list_path_line_to((nk_draw_list *)list_00,pos);
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_path_arc_to_fast(struct nk_draw_list *list, struct nk_vec2 center,
float radius, int a_min, int a_max)
{
int a = 0;
NK_ASSERT(list);
if (!list) return;
if (a_min <= a_max) {
for (a = a_min; a <= a_max; a++) {
const struct nk_vec2 c = list->circle_vtx[(nk_size)a % NK_LEN(list->circle_vtx)];
const float x = center.x + c.x * radius;
const float y = center.y + c.y * radius;
nk_draw_list_path_line_to(list, nk_vec2(x, y));
}
}
}